

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

altsvc * altsvc_createid(char *srchost,char *dsthost,alpnid srcalpnid,alpnid dstalpnid,uint srcport,
                        uint dstport)

{
  unsigned_short uVar1;
  altsvc *as;
  size_t sVar2;
  size_t length;
  long lVar3;
  char *pcVar4;
  
  as = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (as != (altsvc *)0x0) {
    sVar2 = strlen(srchost);
    length = strlen(dsthost);
    if (sVar2 == 0 || length == 0) {
      (*Curl_cfree)(as);
    }
    else {
      if ((sVar2 < 3) || (*srchost != '[')) {
        lVar3 = -(ulong)(srchost[sVar2 - 1] == '.');
      }
      else {
        srchost = srchost + 1;
        lVar3 = -2;
      }
      if ((2 < length) && (*dsthost == '[')) {
        dsthost = dsthost + 1;
        length = length - 2;
      }
      pcVar4 = (char *)Curl_memdup0(srchost,sVar2 + lVar3);
      (as->src).host = pcVar4;
      if (pcVar4 != (char *)0x0) {
        pcVar4 = (char *)Curl_memdup0(dsthost,length);
        (as->dst).host = pcVar4;
        if (pcVar4 != (char *)0x0) {
          (as->src).alpnid = srcalpnid;
          (as->dst).alpnid = dstalpnid;
          uVar1 = curlx_ultous((ulong)srcport);
          (as->src).port = uVar1;
          uVar1 = curlx_ultous((ulong)dstport);
          (as->dst).port = uVar1;
          return as;
        }
      }
      altsvc_free(as);
    }
  }
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      const char *dsthost,
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      unsigned int srcport,
                                      unsigned int dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  size_t hlen;
  size_t dlen;
  if(!as)
    return NULL;
  hlen = strlen(srchost);
  dlen = strlen(dsthost);
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen) {
    /* bad input */
    free(as);
    return NULL;
  }
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.')
    /* strip off trailing dot */
    hlen--;
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = curlx_ultous(srcport);
  as->dst.port = curlx_ultous(dstport);

  return as;
error:
  altsvc_free(as);
  return NULL;
}